

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_casts.cpp
# Opt level: O3

bool duckdb::ListToVarcharCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  VectorType VVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  byte bVar5;
  Vector *pVVar6;
  idx_t iVar7;
  void *pvVar8;
  Vector *vector;
  long lVar9;
  ulong uVar10;
  long lVar11;
  uint *puVar12;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  ulong uVar13;
  idx_t len;
  data_ptr_t pdVar14;
  ulong idx;
  data_ptr_t pdVar15;
  pointer ptr;
  void *pvVar16;
  pointer __old_p;
  ulong uVar17;
  data_ptr_t pdVar18;
  Vector *pVVar19;
  long lVar20;
  undefined1 auVar21 [16];
  anon_struct_16_3_d7536bce_for_pointer aVar22;
  Vector varchar_list;
  ulong local_108;
  code *local_e8;
  code *local_e0;
  LogicalType local_c8;
  LogicalType local_b0;
  Vector local_98;
  
  VVar1 = source->vector_type;
  LogicalType::LogicalType(&local_b0,VARCHAR);
  LogicalType::LIST(&local_c8,&local_b0);
  Vector::Vector(&local_98,&local_c8,count);
  LogicalType::~LogicalType(&local_c8);
  LogicalType::~LogicalType(&local_b0);
  ListCast::ListToListCast(source,&local_98,count,parameters);
  pVVar6 = ListVector::GetEntry(source);
  bVar5 = (pVVar6->type).physical_type_ - LIST;
  if (bVar5 < 7) {
    local_e0 = (code *)(&PTR_CalculateStringLength_019825d0)[bVar5];
    local_e8 = (code *)(&PTR_WriteString_01982608)[bVar5];
  }
  else {
    local_e8 = VectorCastHelpers::WriteEscapedString<false>;
    local_e0 = VectorCastHelpers::CalculateEscapedStringLength<false>;
  }
  Vector::Flatten(&local_98,count);
  pVVar6 = ListVector::GetEntry(&local_98);
  FlatVector::VerifyFlatVector(&local_98);
  iVar7 = ListVector::GetListSize(&local_98);
  Vector::Flatten(pVVar6,iVar7);
  pdVar2 = pVVar6->data;
  FlatVector::VerifyFlatVector(pVVar6);
  if (count == 0) {
    pvVar16 = (void *)0x0;
  }
  else {
    pdVar3 = result->data;
    idx = 0;
    pvVar16 = (void *)0x0;
    do {
      if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[idx >> 6] >>
           (idx & 0x3f) & 1) != 0)) {
        lVar11 = idx * 0x10;
        iVar7 = *(idx_t *)(local_98.data + lVar11);
        uVar10 = *(ulong *)(local_98.data + lVar11 + 8);
        len = iVar7;
        pvVar8 = pvVar16;
        if ((local_108 < uVar10 || pvVar16 == (void *)0x0) &&
           (pvVar8 = operator_new__(uVar10), len = extraout_RDX, local_108 = uVar10,
           pvVar16 != (void *)0x0)) {
          operator_delete__(pvVar16);
          len = extraout_RDX_00;
        }
        pvVar16 = pvVar8;
        if (uVar10 == 0) {
          vector = (Vector *)0x2;
        }
        else {
          pdVar14 = pdVar2 + iVar7 * 0x10;
          vector = (Vector *)0x2;
          uVar17 = 0;
          do {
            pVVar19 = (Vector *)&vector->field_0x2;
            if (uVar17 == 0) {
              pVVar19 = vector;
            }
            puVar4 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar4 == (unsigned_long *)0x0) ||
               (uVar13 = iVar7 + uVar17 >> 6, (puVar4[uVar13] >> (iVar7 + uVar17 & 0x3f) & 1) != 0))
            {
              auVar21 = (*local_e0)(pdVar14,uVar17 + (long)pvVar16);
            }
            else {
              auVar21._8_8_ = uVar13;
              auVar21._0_8_ = 4;
            }
            len = auVar21._8_8_;
            vector = (Vector *)(&pVVar19->vector_type + auVar21._0_8_);
            uVar17 = uVar17 + 1;
            pdVar14 = pdVar14 + 0x10;
          } while (uVar10 != uVar17);
        }
        aVar22 = (anon_struct_16_3_d7536bce_for_pointer)
                 StringVector::EmptyString((StringVector *)result,vector,len);
        pdVar14 = pdVar3 + lVar11 + 4;
        pdVar18 = (data_ptr_t)aVar22.ptr;
        if (aVar22.length < 0xd) {
          pdVar18 = pdVar14;
        }
        ((anon_union_16_2_67f50693_for_value *)(pdVar14 + -4))->pointer = aVar22;
        *pdVar18 = '[';
        if (uVar10 == 0) {
          lVar20 = 1;
        }
        else {
          pdVar15 = pdVar2 + iVar7 * 0x10;
          lVar20 = 1;
          uVar17 = 0;
          do {
            if (uVar17 != 0) {
              (pdVar18 + lVar20)[0] = ',';
              (pdVar18 + lVar20)[1] = ' ';
              lVar20 = lVar20 + 2;
            }
            puVar4 = (pVVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar4 == (unsigned_long *)0x0) ||
               ((puVar4[iVar7 + uVar17 >> 6] >> (iVar7 + uVar17 & 0x3f) & 1) != 0)) {
              lVar9 = (*local_e8)(pdVar18 + lVar20,pdVar15,*(undefined1 *)((long)pvVar16 + uVar17));
            }
            else {
              builtin_memcpy(pdVar18 + lVar20,"NULL",4);
              lVar9 = 4;
            }
            lVar20 = lVar9 + lVar20;
            uVar17 = uVar17 + 1;
            pdVar15 = pdVar15 + 0x10;
          } while (uVar10 != uVar17);
        }
        puVar12 = (uint *)(pdVar3 + lVar11);
        pdVar18[lVar20] = ']';
        uVar10 = (ulong)*puVar12;
        if (uVar10 < 0xd) {
          switchD_00569a20::default(pdVar14 + uVar10,0,0xc - uVar10);
        }
        else {
          puVar12[1] = **(uint **)(puVar12 + 2);
        }
      }
      else {
        FlatVector::SetNull(result,idx,true);
      }
      idx = idx + 1;
    } while (idx != count);
  }
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  if (pvVar16 != (void *)0x0) {
    operator_delete__(pvVar16);
  }
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  return true;
}

Assistant:

static bool ListToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto constant = source.GetVectorType() == VectorType::CONSTANT_VECTOR;
	// first cast the child vector to varchar
	Vector varchar_list(LogicalType::LIST(LogicalType::VARCHAR), count);
	ListCast::ListToListCast(source, varchar_list, count, parameters);

	auto &child_vec = ListVector::GetEntry(source);
	auto child_is_nested = child_vec.GetType().IsNested();
	auto string_length_func = child_is_nested ? VectorCastHelpers::CalculateStringLength
	                                          : VectorCastHelpers::CalculateEscapedStringLength<false>;
	auto write_string_func =
	    child_is_nested ? VectorCastHelpers::WriteString : VectorCastHelpers::WriteEscapedString<false>;

	// now construct the actual varchar vector
	varchar_list.Flatten(count);
	auto &child = ListVector::GetEntry(varchar_list);
	auto list_data = FlatVector::GetData<list_entry_t>(varchar_list);
	auto &validity = FlatVector::Validity(varchar_list);

	child.Flatten(ListVector::GetListSize(varchar_list));
	auto child_data = FlatVector::GetData<string_t>(child);
	auto &child_validity = FlatVector::Validity(child);

	auto result_data = FlatVector::GetData<string_t>(result);
	static constexpr const idx_t SEP_LENGTH = 2;
	static constexpr const idx_t NULL_LENGTH = 4;
	unsafe_unique_array<bool> needs_quotes;
	idx_t needs_quotes_length;

	for (idx_t i = 0; i < count; i++) {
		if (!validity.RowIsValid(i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}
		auto list = list_data[i];
		// figure out how long the result needs to be
		idx_t list_length = 2; // "[" and "]"
		if (!needs_quotes || list.length > needs_quotes_length) {
			needs_quotes = make_unsafe_uniq_array_uninitialized<bool>(list.length);
			needs_quotes_length = list.length;
		}
		for (idx_t list_idx = 0; list_idx < list.length; list_idx++) {
			auto idx = list.offset + list_idx;
			if (list_idx > 0) {
				list_length += SEP_LENGTH; // ", "
			}
			// string length, or "NULL"
			if (child_validity.RowIsValid(idx)) {
				list_length += string_length_func(child_data[idx], needs_quotes[list_idx]);
			} else {
				list_length += NULL_LENGTH;
			}
		}
		result_data[i] = StringVector::EmptyString(result, list_length);
		auto dataptr = result_data[i].GetDataWriteable();
		idx_t offset = 0;
		dataptr[offset++] = '[';
		for (idx_t list_idx = 0; list_idx < list.length; list_idx++) {
			auto idx = list.offset + list_idx;
			if (list_idx > 0) {
				memcpy(dataptr + offset, ", ", SEP_LENGTH);
				offset += SEP_LENGTH;
			}
			if (child_validity.RowIsValid(idx)) {
				offset += write_string_func(dataptr + offset, child_data[idx], needs_quotes[list_idx]);
			} else {
				memcpy(dataptr + offset, "NULL", NULL_LENGTH);
				offset += NULL_LENGTH;
			}
		}
		dataptr[offset] = ']';
		result_data[i].Finalize();
	}

	if (constant) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	return true;
}